

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

void __thiscall iutest::AssertionHelper::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  bool bVar1;
  ScopedTrace *this_00;
  ScopedMessage *local_18;
  ScopedMessage *local_10;
  ScopedMessage *this_local;
  
  local_10 = this;
  this_00 = ScopedTrace::GetInstance();
  local_18 = this;
  std::__cxx11::
  list<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
  ::remove(&this_00->list,(char *)&local_18);
  bVar1 = stl::uncaught_exception();
  if (bVar1) {
    detail::UncaughtScopedTrace::Add(&this->super_iuCodeMessage);
  }
  detail::iuCodeMessage::~iuCodeMessage(&this->super_iuCodeMessage);
  return;
}

Assistant:

~ScopedMessage()
        {
            ScopedTrace::GetInstance().list.remove(this);
            if( stl::uncaught_exception() )
            {
                detail::UncaughtScopedTrace::Add(*this);
            }
        }